

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::InitProtobufDefaultsSlow(void)

{
  int iVar1;
  
  if (InitProtobufDefaultsSlow()::is_inited == '\0') {
    iVar1 = __cxa_guard_acquire(&InitProtobufDefaultsSlow()::is_inited);
    if (iVar1 != 0) {
      fixed_address_empty_string = &DAT_00388820;
      DAT_00388818 = 0;
      DAT_00388820 = 0;
      OnShutdownRun(DestroyString,&fixed_address_empty_string);
      init_protobuf_defaults_state = 1;
      __cxa_guard_release(&InitProtobufDefaultsSlow()::is_inited);
      return;
    }
  }
  return;
}

Assistant:

void InitProtobufDefaultsSlow() {
  static bool is_inited = InitProtobufDefaultsImpl();
  (void)is_inited;
}